

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O2

void OpenMesh::IO::assignCustomProperty<int>
               (istream *_in,BaseImporter *_bi,VertexHandle _vh,string *_propName)

{
  value_type vVar1;
  bool bVar2;
  undefined4 in_EAX;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pvVar4;
  value_type local_38;
  VPropHandleT<int> local_34;
  int in;
  VPropHandleT<int> prop;
  
  _local_38 = CONCAT44(0xffffffff,in_EAX);
  iVar3 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  bVar2 = BaseKernel::get_property_handle<int>
                    ((BaseKernel *)CONCAT44(extraout_var,iVar3),&local_34,_propName);
  if (!bVar2) {
    iVar3 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
    BaseKernel::add_property<int>((BaseKernel *)CONCAT44(extraout_var_00,iVar3),&local_34,_propName)
    ;
  }
  std::istream::operator>>(_in,&local_38);
  vVar1 = local_38;
  iVar3 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  pvVar4 = BaseKernel::property<int>((BaseKernel *)CONCAT44(extraout_var_01,iVar3),local_34,_vh);
  *pvVar4 = vVar1;
  return;
}

Assistant:

void assignCustomProperty(std::istream& _in, BaseImporter& _bi, VertexHandle _vh, const std::string& _propName)
{
  OpenMesh::VPropHandleT<T> prop;
  if (!_bi.kernel()->get_property_handle(prop,_propName))
    _bi.kernel()->add_property(prop,_propName);
  T in;
  _in >> in;
  _bi.kernel()->property(prop,_vh) = in;
}